

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Function<kj::Promise<void>_(kj::StringPtr)> * __thiscall
kj::_::NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>>::
emplace<kj::Function<kj::Promise<void>(kj::StringPtr)>>
          (NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>> *this,
          Function<kj::Promise<void>_(kj::StringPtr)> *params)

{
  Iface *pIVar1;
  
  if (*this == (NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>>)0x1) {
    *this = (NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>>)0x0;
    Own<kj::Function<kj::Promise<void>_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
              ((Own<kj::Function<kj::Promise<void>_(kj::StringPtr)>::Iface,_std::nullptr_t> *)
               (this + 8));
  }
  pIVar1 = (params->impl).ptr;
  *(Disposer **)(this + 8) = (params->impl).disposer;
  *(Iface **)(this + 0x10) = pIVar1;
  (params->impl).ptr = (Iface *)0x0;
  *this = (NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>>)0x1;
  return (Function<kj::Promise<void>_(kj::StringPtr)> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }